

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

int whiptailPresent(void)

{
  int iVar1;
  char *pcVar2;
  int local_c;
  int lWhiptailPresent;
  
  local_c = whiptailPresentOnly();
  if ((local_c == 0) ||
     ((iVar1 = isTerminalRunning(), iVar1 == 0 && (pcVar2 = terminalName(), pcVar2 == (char *)0x0)))
     ) {
    local_c = 0;
  }
  return local_c;
}

Assistant:

static int whiptailPresent( )
{
        int lWhiptailPresent ;
    lWhiptailPresent = whiptailPresentOnly( ) ;
        if ( lWhiptailPresent && ( isTerminalRunning() || terminalName() ) )
        {
                return lWhiptailPresent ;
        }
        else
        {
                return 0 ;
        }
}